

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::SetupResults(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *this_00;
  pointer settings;
  pointer pSVar1;
  SimpleParallelAnalyzer *this_local;
  
  this_00 = (SimpleParallelAnalyzerResults *)operator_new(0x20);
  settings = std::
             unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
             ::get(&this->mSettings);
  SimpleParallelAnalyzerResults::SimpleParallelAnalyzerResults(this_00,this,settings);
  std::
  unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>::
  reset(&this->mResults,this_00);
  std::
  unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>::
  get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  pSVar1 = std::
           unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
           ::operator->(&this->mResults);
  std::
  unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>::
  operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)pSVar1);
  return;
}

Assistant:

void SimpleParallelAnalyzer::SetupResults()
{
    mResults.reset( new SimpleParallelAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mClockChannel );
}